

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcConstVal::set_float(CTcConstVal *this,vbignum_t *val,int promoted)

{
  ushort uVar1;
  ushort *puVar2;
  CBigNumStringBufPrsAlo alo;
  IBigNumStringBuf local_18;
  
  local_18._vptr_IBigNumStringBuf = (_func_int **)&PTR_get_buf_00318c70;
  puVar2 = (ushort *)
           CVmObjBigNum::cvt_to_string_gen(&local_18,val->ext_,-1,-1,-1,-1,0x10,(char *)0x0,0);
  uVar1 = *puVar2;
  this->typ_ = TC_CVT_FLOAT;
  (this->val_).floatval_.txt_ = (char *)(puVar2 + 1);
  *(ulong *)((long)&this->val_ + 8) = (ulong)uVar1;
  this->field_0x20 = this->field_0x20 & 0xfd | (char)promoted * '\x02' & 2U;
  return;
}

Assistant:

void CTcConstVal::set_float(const vbignum_t *val, int promoted)
{
    /* format the value */
    CBigNumStringBufPrsAlo alo;
    const char *buf = val->format(&alo);

    /* 
     *   read the length from the buffer - vbignum_t::format() fills in the
     *   buffer using the TADS String format, with a two-byte little-endian
     *   (VMB_LEN) length prefix 
     */
    size_t len = vmb_get_len(buf);
    buf += VMB_LEN;

    /* store it */
    set_float(buf, len, promoted);
}